

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Print.H
# Opt level: O2

void __thiscall amrex::Print::Print(Print *this,int rank_,ostream *os_)

{
  this->rank = rank_;
  this->comm = *(MPI_Comm *)(DAT_007dd980 + -0x48);
  this->os = os_;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->ss);
  *(undefined8 *)(&this->field_0x18 + *(long *)(*(long *)&this->ss + -0x18)) =
       *(undefined8 *)(this->os + *(long *)(*(long *)this->os + -0x18) + 8);
  return;
}

Assistant:

Print (int rank_, std::ostream& os_ = amrex::OutStream())
            : rank(rank_)
            , comm(ParallelContext::CommunicatorSub())
            , os(os_)
            { ss.precision(os.precision()); }